

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O2

void __thiscall embree::InstanceArray::~InstanceArray(InstanceArray *this)

{
  size_t *psVar1;
  long *plVar2;
  Device *pDVar3;
  size_t i_1;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__InstanceArray_021d55a0;
  plVar2 = *(long **)&(this->super_Geometry).field_0x58;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))();
  }
  if (this->objects != (Accel **)0x0) {
    for (uVar4 = 0; uVar4 < this->numObjects; uVar4 = uVar4 + 1) {
      if (this->objects[uVar4] != (Accel *)0x0) {
        (*(this->objects[uVar4]->super_AccelData).super_RefCount._vptr_RefCount[3])();
      }
    }
    pDVar3 = (this->super_Geometry).device;
    (*(pDVar3->super_State).super_RefCount._vptr_RefCount[9])(pDVar3,this->objects);
  }
  pDVar3 = (this->super_Geometry).device;
  (*(pDVar3->super_State).super_RefCount._vptr_RefCount[4])(pDVar3,0xffffffffffffff30,0);
  RawBufferView::~RawBufferView(&(this->object_ids).super_RawBufferView);
  psVar1 = &(this->l2w_buf).size_active;
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < *psVar1; uVar4 = uVar4 + 1) {
    RawBufferView::~RawBufferView
              ((RawBufferView *)((long)&((this->l2w_buf).items)->ptr_ofs + lVar5));
    lVar5 = lVar5 + 0x38;
  }
  pDVar3 = (this->l2w_buf).alloc.device;
  if (pDVar3 != (Device *)0x0) {
    (*(pDVar3->super_State).super_RefCount._vptr_RefCount[9])(pDVar3,(this->l2w_buf).items);
  }
  *psVar1 = 0;
  (this->l2w_buf).size_alloced = 0;
  (this->l2w_buf).items = (RawBufferView *)0x0;
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

InstanceArray::~InstanceArray()
  {
    if (object) object->refDec();
    if (objects) {
      for (size_t i = 0; i < numObjects; ++i) {
        if (objects[i]) objects[i]->refDec();
      }
      device->free(objects);
    }
    device->memoryMonitor(-sizeof(*this), false);
  }